

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qset.h
# Opt level: O0

QList<QGraphicsItem_*> * __thiscall QSet<QGraphicsItem_*>::values(QSet<QGraphicsItem_*> *this)

{
  long lVar1;
  bool bVar2;
  QSet<QGraphicsItem_*> *in_RSI;
  parameter_type in_RDI;
  long in_FS_OFFSET;
  qsizetype in_stack_00000018;
  QList<QGraphicsItem_*> *result;
  const_iterator i;
  parameter_type this_00;
  QList<QGraphicsItem_*> *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ((DataPointer *)&in_RDI->_vptr_QGraphicsItem)->d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d_ptr).d = (QGraphicsItemPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI[1]._vptr_QGraphicsItem = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QList<QGraphicsItem_*>::QList((QList<QGraphicsItem_*> *)0x9ded80);
  size((QSet<QGraphicsItem_*> *)0x9ded8a);
  QList<QGraphicsItem_*>::reserve(in_stack_ffffffffffffffd8,in_stack_00000018);
  constBegin(in_RSI);
  while( true ) {
    constEnd(in_RSI);
    bVar2 = const_iterator::operator!=((const_iterator *)this_00,(const_iterator *)in_RDI);
    if (!bVar2) break;
    const_iterator::operator*((const_iterator *)0x9dedec);
    QList<QGraphicsItem_*>::append((QList<QGraphicsItem_*> *)0x9dedf9,in_RDI);
    const_iterator::operator++((const_iterator *)this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QList<QGraphicsItem_*> *)in_RDI;
}

Assistant:

Q_OUTOFLINE_TEMPLATE QList<T> QSet<T>::values() const
{
    QList<T> result;
    result.reserve(size());
    typename QSet<T>::const_iterator i = constBegin();
    while (i != constEnd()) {
        result.append(*i);
        ++i;
    }
    return result;
}